

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::post_init(PeleLM *this,Real stop_time)

{
  size_type __n;
  BoxArray *bxs;
  DistributionMapping *dm;
  ostringstream *poVar1;
  pointer pSVar2;
  pointer puVar3;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var4;
  MultiFab *pMVar5;
  Amr *pAVar6;
  void *pvVar7;
  PeleLM *pPVar8;
  TimeCenter TVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int lev;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  Real RVar18;
  double dVar19;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  Real dt_init;
  Vector<double,_std::allocator<double>_> dt_save;
  Real dt_init2;
  Vector<int,_std::allocator<int>_> nc_save;
  Vector<double,_std::allocator<double>_> dt_save2;
  Vector<int,_std::allocator<int>_> nc_save2;
  Vector<double,_std::allocator<double>_> dt_level;
  MultiFab Forcing_tmp;
  Real local_440;
  Real local_438;
  int local_42c;
  double local_428;
  undefined8 uStack_420;
  PeleLM *local_410;
  vector<double,_std::allocator<double>_> local_408;
  ulong local_3f0;
  Real local_3e8;
  double local_3e0;
  Real local_3d8;
  vector<int,_std::allocator<int>_> local_3d0;
  vector<double,_std::allocator<double>_> local_3b8;
  double local_3a0;
  size_type local_398;
  ulong local_390;
  ulong local_388;
  vector<int,_std::allocator<int>_> local_380;
  MFInfo local_368;
  Print local_340;
  undefined1 local_1b8 [192];
  IntVect local_f8;
  int local_ec;
  
  if ((this->super_NavierStokesBase).super_AmrLevel.level < 1) {
    local_3e8 = stop_time;
    local_3a0 = amrex::ParallelDescriptor::second();
    pSVar2 = (this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar9 = amrex::StateDescriptor::timeType(pSVar2->desc);
    if (TVar9 == Point) {
      local_438 = (pSVar2->new_time).stop;
    }
    else {
      local_438 = ((pSVar2->new_time).start + (pSVar2->new_time).stop) * 0.5;
    }
    uVar11 = (ulong)*(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore)
                             .super_AmrMesh.super_AmrInfo.field_0x8c;
    local_440 = 0.0;
    local_3d8 = 0.0;
    __n = uVar11 + 1;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_408,__n,(allocator_type *)&local_340);
    std::vector<int,_std::allocator<int>_>::vector(&local_3d0,__n,(allocator_type *)&local_340);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_3b8,__n,(allocator_type *)&local_340);
    std::vector<int,_std::allocator<int>_>::vector(&local_380,__n,(allocator_type *)&local_340);
    local_428 = 0.0;
    uStack_420 = 0;
    local_3f0 = uVar11;
    if (lev0cellCount < 0.0) {
      lev0cellCount = getCellsCount(this);
    }
    iVar10 = (int)local_3f0;
    uVar14 = local_3f0 & 0xffffffff;
    uVar11 = local_3f0;
    if (closed_chamber == 1) {
      for (; 0 < (long)uVar11; uVar11 = uVar11 - 1) {
        puVar3 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             puVar3[uVar11 - 1]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        NavierStokesBase::average_down
                  ((NavierStokesBase *)
                   _Var4.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                   *(MultiFab **)
                    (*(long *)((long)puVar3[uVar11]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0),
                   *(MultiFab **)
                    (*(long *)&(((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                                ((long)_Var4.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                                + 0x170))->
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>).
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                     + (long)NavierStokesBase::Divu_Type * 0xe0 + 200),0,1);
      }
      if (-1 < iVar10) {
        local_428 = 0.0;
        uStack_420 = 0;
        lVar12 = 0;
        do {
          pMVar5 = *(MultiFab **)
                    (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                     amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0);
          if (lVar12 == 0) {
            RVar18 = getMFsum(this,pMVar5,0);
            local_428 = RVar18 / lev0cellCount;
            uStack_420 = extraout_XMM0_Qb;
          }
          amrex::MultiFab::plus(pMVar5,-local_428,0,1,0);
          lVar12 = lVar12 + 1;
        } while (uVar14 + 1 != lVar12);
      }
    }
    NavierStokesBase::post_init_state(&this->super_NavierStokesBase);
    if ((closed_chamber == 1) && (-1 < iVar10)) {
      lVar12 = 0;
      do {
        amrex::MultiFab::plus
                  (*(MultiFab **)
                    (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                     amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0),local_428,0
                   ,1,0);
        lVar12 = lVar12 + 1;
      } while (uVar14 + 1 != lVar12);
    }
    NavierStokesBase::post_init_estDT
              (&this->super_NavierStokesBase,&local_440,
               (Vector<int,_std::allocator<int>_> *)&local_3d0,
               (Vector<double,_std::allocator<double>_> *)&local_408,local_3e8);
    bVar16 = NavierStokesBase::do_init_proj != 0;
    bVar17 = NavierStokesBase::projector != (Projection *)0x0;
    local_42c = num_divu_iters;
    local_398 = __n;
    if (NavierStokesBase::verbose != 0) {
      local_340.os = amrex::OutStream();
      local_340.rank = *(int *)(DAT_00756620 + -0x30);
      poVar1 = &local_340.ss;
      local_340.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(local_1b8 + *(long *)(local_340._16_8_ + -0x18) + -0x170) =
           *(undefined8 *)(local_340.os + *(long *)(*(long *)local_340.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Doing ",7);
      std::ostream::operator<<(poVar1,num_divu_iters);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," initial divu iters \n",0x15);
      amrex::Print::~Print(&local_340);
    }
    if (0 < local_42c && (bVar16 && bVar17)) {
      uVar11 = (ulong)(iVar10 + 1);
      uVar14 = 0;
      local_410 = this;
      local_388 = uVar11;
      do {
        local_390 = uVar14;
        if (-1 < iVar10) {
          uVar14 = 0;
          do {
            pPVar8 = local_410;
            pAVar6 = (local_410->super_NavierStokesBase).super_AmrLevel.parent;
            pMVar5 = *(MultiFab **)
                      (*(long *)((long)(pAVar6->amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + 0x170) + 200);
            bxs = &(pMVar5->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
            dm = &(pMVar5->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
            local_1b8._0_8_ = (_func_int **)0x1;
            local_1b8._24_8_ = 0;
            local_1b8._32_8_ = 0;
            local_1b8._8_8_ = 0;
            local_1b8._16_8_ = 0;
            amrex::MultiFab::MultiFab
                      ((MultiFab *)&local_340,bxs,dm,
                       (pMVar5->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0,
                       (MFInfo *)local_1b8,
                       *(FabFactory<amrex::FArrayBox> **)
                        ((long)(pAVar6->amr_level).
                               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + 0x218));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_1b8 + 0x10));
            local_368.alloc = true;
            local_368._1_7_ = 0;
            local_368.tags.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_368.tags.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_368.arena = (Arena *)0x0;
            local_368.tags.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            amrex::MultiFab::MultiFab
                      ((MultiFab *)local_1b8,bxs,dm,10,0,&local_368,
                       *(FabFactory<amrex::FArrayBox> **)
                        ((long)(((pPVar8->super_NavierStokesBase).super_AmrLevel.parent)->amr_level)
                               .
                               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + 0x218));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_368.tags.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
            amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)local_1b8,0.0,0,local_ec,&local_f8);
            advance_chemistry((PeleLM *)
                              (((local_410->super_NavierStokesBase).super_AmrLevel.parent)->
                              amr_level).
                              super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ,pMVar5,(MultiFab *)&local_340,
                              local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar14] * 0.5,(MultiFab *)local_1b8);
            amrex::MultiFab::~MultiFab((MultiFab *)local_1b8);
            amrex::MultiFab::~MultiFab((MultiFab *)&local_340);
            uVar14 = uVar14 + 1;
            uVar11 = local_388;
          } while (local_388 != uVar14);
        }
        uVar14 = local_3f0;
        this = local_410;
        if (-1 < iVar10) {
          uVar15 = 0;
          do {
            (**(code **)(*(long *)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level
                                  ).
                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + 0x168))
                      (local_438,
                       local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15]);
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        uVar15 = uVar14;
        if (hack_noavgdivu == 0) {
          for (; 0 < (long)uVar15; uVar15 = uVar15 - 1) {
            puVar3 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
            .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                 puVar3[uVar15 - 1]._M_t.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
            NavierStokesBase::average_down
                      ((NavierStokesBase *)
                       _Var4.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                       *(MultiFab **)
                        (*(long *)((long)puVar3[uVar15]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0),
                       *(MultiFab **)
                        (*(long *)&(((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                                    ((long)_Var4.
                                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                           _M_head_impl + 0x170))->
                                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                   ).
                                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                         + (long)NavierStokesBase::Divu_Type * 0xe0 + 200),0,1);
          }
        }
        lVar12 = (long)NavierStokesBase::Divu_Type;
        pSVar2 = (this->super_NavierStokesBase).super_AmrLevel.state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start;
        TVar9 = amrex::StateDescriptor::timeType(pSVar2[lVar12].desc);
        if (TVar9 == Point) {
          local_3e0 = pSVar2[lVar12].new_time.stop;
        }
        else {
          local_3e0 = (pSVar2[lVar12].new_time.start + pSVar2[lVar12].new_time.stop) * 0.5;
        }
        if ((closed_chamber == 1) && (-1 < (int)uVar14)) {
          uVar15 = 0;
          do {
            pMVar5 = *(MultiFab **)
                      (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                       amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0);
            if (uVar15 == 0) {
              RVar18 = getMFsum(this,pMVar5,0);
              local_428 = RVar18 / lev0cellCount;
              uStack_420 = extraout_XMM0_Qb_00;
            }
            amrex::MultiFab::plus(pMVar5,-local_428,0,1,0);
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        Projection::initialVelocityProject(NavierStokesBase::projector,0,local_3e0,1,1);
        if ((closed_chamber == 1) && (-1 < iVar10)) {
          uVar15 = 0;
          do {
            amrex::MultiFab::plus
                      (*(MultiFab **)
                        (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                         amr_level).
                                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         .
                                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0),
                       local_428,0,1,0);
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        for (; 0 < (long)uVar14; uVar14 = uVar14 - 1) {
          puVar3 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               puVar3[uVar14 - 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          NavierStokesBase::average_down
                    ((NavierStokesBase *)
                     _Var4.
                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                     .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                     *(MultiFab **)
                      (*(long *)((long)puVar3[uVar14]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + 0x170) + 200),
                     *(MultiFab **)
                      (*(long *)&(((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                                  ((long)_Var4.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                         _M_head_impl + 0x170))->
                                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>).
                                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                      + 200),0,3);
        }
        amrex::Amr::setNCycle
                  ((this->super_NavierStokesBase).super_AmrLevel.parent,
                   (Vector<int,_std::allocator<int>_> *)&local_3d0);
        NavierStokesBase::post_init_estDT
                  (&this->super_NavierStokesBase,&local_3d8,
                   (Vector<int,_std::allocator<int>_> *)&local_380,
                   (Vector<double,_std::allocator<double>_> *)&local_3b8,local_3e8);
        RVar18 = local_3d8;
        if (local_440 <= local_3d8) {
          RVar18 = local_440;
        }
        local_440 = RVar18;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_340,local_398,&local_440,
                   (allocator_type *)local_1b8);
        amrex::Amr::setDtLevel
                  ((this->super_NavierStokesBase).super_AmrLevel.parent,
                   (Vector<double,_std::allocator<double>_> *)&local_340);
        if (-1 < iVar10) {
          uVar14 = 0;
          do {
            dVar19 = local_3b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
            if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14] <=
                local_3b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14]) {
              dVar19 = local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
            }
            local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] = dVar19;
            (**(code **)(*(long *)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level
                                  ).
                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + 0xc0))(local_438,local_440,local_440);
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        uVar14 = local_390;
        pvVar7 = (void *)CONCAT44(local_340.comm,local_340.rank);
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,local_340._16_8_ - (long)pvVar7);
        }
        uVar13 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar13;
      } while ((bVar16 && bVar17) && (int)uVar13 < local_42c);
    }
    post_init_press(this,&local_440,(Vector<int,_std::allocator<int>_> *)&local_3d0,
                    (Vector<double,_std::allocator<double>_> *)&local_408);
    if (0 < NavierStokesBase::sum_interval) {
      (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x38])(this);
    }
    if (2 < NavierStokesBase::verbose) {
      local_438 = amrex::ParallelDescriptor::second();
      local_340.os = amrex::OutStream();
      local_340.rank = *(int *)(DAT_00756620 + -0x30);
      poVar1 = &local_340.ss;
      local_340.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(local_1b8 + *(long *)(local_340._16_8_ + -0x18) + -0x170) =
           *(undefined8 *)(local_340.os + *(long *)(*(long *)local_340.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"      PeleLM::post_init(): lev: ",0x20);
      std::ostream::operator<<(poVar1,(this->super_NavierStokesBase).super_AmrLevel.level);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", time: ",8);
      std::ostream::_M_insert<double>(local_438 - local_3a0);
      local_1b8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1b8,1);
      amrex::Print::~Print(&local_340);
    }
    if (local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_380.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_3b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
PeleLM::post_init (Real stop_time)
{
  BL_PROFILE("PLM::post_init()");
  if (level > 0)
    //
    // Nothing to sync up at level > 0.
    //
    return;

  const Real strt_time    = ParallelDescriptor::second();
  const Real tnp1         = state[State_Type].curTime();
  const int  finest_level = parent->finestLevel();
  Real dt_init  = 0.0;
  Real dt_init2 = 0.0;
  Real Sbar     = 0.0;

  Vector<Real> dt_save(finest_level+1);
  Vector<int>  nc_save(finest_level+1);
  Vector<Real> dt_save2(finest_level+1);
  Vector<int>  nc_save2(finest_level+1);

  // Get level 0 cells count / uncovered cells count with EB
  if ( lev0cellCount < 0.0 ) {
     lev0cellCount = getCellsCount();
  }

  // ensure system is solvable by creating deltaS = S - Sbar
  if (closed_chamber == 1)
  {
    // ensure divu is average down so computing deltaS = S - Sbar works for multilevel
    for (int lev = finest_level-1; lev >= 0; lev--)
    {
      PeleLM&   fine_lev = getLevel(lev+1);
      PeleLM&   crse_lev = getLevel(lev);

      MultiFab& Divu_crse = crse_lev.get_new_data(Divu_Type);
      MultiFab& Divu_fine = fine_lev.get_new_data(Divu_Type);

      crse_lev.average_down(Divu_fine, Divu_crse, 0, 1);
    }

    // compute Sbar and subtract from S
    for (int lev = 0; lev <= finest_level; lev++)
    {
      // pointer to S
      MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
      if (lev == 0) {
        // Get S sum
        Real Ssum = getMFsum(divu_lev,0);

        // Normalize by cell count / uncovered cell count if EB
        Sbar = Ssum/lev0cellCount;
      }
      divu_lev.plus(-Sbar,0,1);
    }
  }

  //
  // Ensure state is consistent, i.e. velocity field satisfies initial
  // estimate of constraint, coarse levels are fine level averages, pressure
  // is zero.
  //
  post_init_state();

  if (closed_chamber == 1)
  {
    // restore S
    for (int lev = 0; lev <= finest_level; lev++)
    {
      MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
      divu_lev.plus(Sbar,0,1);
    }
  }

  //
  // Estimate the initial timestepping.
  //
  post_init_estDT(dt_init,nc_save,dt_save,stop_time);
  //
  // Better estimate needs dt to estimate divu
  //
  const bool do_iter        = do_init_proj && projector;
  const int  init_divu_iter = do_iter ? num_divu_iters : 0;

  if (verbose) {
    amrex::Print() << " Doing " << num_divu_iters << " initial divu iters \n";
  }
  for (int iter = 0; iter < init_divu_iter; ++iter)
  {
    //
    // Update species destruction rates in each level but not state.
    //
    if (NUM_SPECIES > 0)
    {

      for (int k = 0; k <= finest_level; k++)
      {

        MultiFab& S_new = getLevel(k).get_new_data(State_Type);

        //
        // Don't update S_new in this strang_chem() call ...
        //
        MultiFab S_tmp(S_new.boxArray(),S_new.DistributionMap(),S_new.nComp(),0,MFInfo(),getLevel(k).Factory());
        MultiFab Forcing_tmp(S_new.boxArray(),S_new.DistributionMap(),NUM_SPECIES+1,0,MFInfo(),getLevel(k).Factory());
        Forcing_tmp.setVal(0);

        getLevel(k).advance_chemistry(S_new,S_tmp,dt_save[k]/2.0,Forcing_tmp);
      }
    }
    //
    // Recompute the velocity to obey constraint with chemistry and
    // divqrad and then average that down.
    //
    if (NUM_SPECIES > 0)
    {
      for (int k = 0; k <= finest_level; k++)
      {
        MultiFab&  Divu_new = getLevel(k).get_new_data(Divu_Type);
        getLevel(k).calc_divu(tnp1,dt_save[k],Divu_new);
      }

      if (!hack_noavgdivu)
      {
        for (int lev = finest_level-1; lev >= 0; lev--)
        {
          PeleLM&   fine_lev = getLevel(lev+1);
          PeleLM&   crse_lev = getLevel(lev);
          MultiFab& Divu_crse = crse_lev.get_new_data(Divu_Type);
          MultiFab& Divu_fine = fine_lev.get_new_data(Divu_Type);
          crse_lev.average_down(Divu_fine, Divu_crse, 0, 1);
        }
      }
      //
      // Recompute the initial velocity field based on this new constraint
      //
      const Real divu_time = state[Divu_Type].curTime();

      int havedivu = 1;

      // ensure system is solvable by creating deltaS = S - Sbar
      if (closed_chamber == 1)
      {
        // compute Sbar and subtract from S
        for (int lev = 0; lev <= finest_level; lev++)
        {
          // pointer to S
          MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
          if (lev == 0) {
             // Get S sum
             Real Ssum = getMFsum(divu_lev,0);

             // Normalize by cell count / uncovered cell count if EB
             Sbar = Ssum/lev0cellCount;
          }
          divu_lev.plus(-Sbar,0,1);
        }
      }

      projector->initialVelocityProject(0,divu_time,havedivu,1);

      if (closed_chamber == 1)
      {
        // restore S
        for (int lev = 0; lev <= finest_level; lev++)
        {
          MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
          divu_lev.plus(Sbar,0,1);
        }
      }

      //
      // Average down the new velocity
      //
      for (int k = finest_level-1; k >= 0; k--)
      {
        PeleLM&   fine_lev = getLevel(k+1);
        PeleLM&   crse_lev = getLevel(k);
        MultiFab&       S_fine  = fine_lev.get_new_data(State_Type);
        MultiFab&       S_crse  = crse_lev.get_new_data(State_Type);

        crse_lev.average_down(S_fine, S_crse, Xvel, AMREX_SPACEDIM);
      }
    }
    //
    // Estimate the initial timestepping again, using new velocity
    // (necessary?) Need to pass space to save dt, nc, but these are
    // hacked, just pass something.
    //
    // reset Ncycle to nref...
    //
    parent->setNCycle(nc_save);
    post_init_estDT(dt_init2, nc_save2, dt_save2, stop_time);
    //
    // Compute dt_init,dt_save as the minimum of the values computed
    // in the calls to post_init_estDT
    // Then setTimeLevel and dt_level to these values.
    //
    dt_init = std::min(dt_init,dt_init2);
    Vector<Real> dt_level(finest_level+1,dt_init);

    parent->setDtLevel(dt_level);
    for (int k = 0; k <= finest_level; k++)
    {
      dt_save[k] = std::min(dt_save[k],dt_save2[k]);
      getLevel(k).setTimeLevel(tnp1,dt_init,dt_init);
    }
  } // end divu_iters

  //
  // Initialize the pressure by iterating the initial timestep.
  //
  post_init_press(dt_init, nc_save, dt_save);
  //
  // Compute the initial estimate of conservation.
  //
  if (sum_interval > 0)
    sum_integrated_quantities();

  if (verbose > 2)
  {
    const int IOProc   = ParallelDescriptor::IOProcessorNumber();
    Real      run_time = ParallelDescriptor::second() - strt_time;

    ParallelDescriptor::ReduceRealMax(run_time,IOProc);

    amrex::Print() << "      PeleLM::post_init(): lev: " << level << ", time: " << run_time << '\n';
  }
}